

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O1

void __thiscall Fl_Return_Button_Type::ideal_size(Fl_Return_Button_Type *this,int *w,int *h)

{
  Fl_Widget *pFVar1;
  int iVar2;
  
  Fl_Widget_Type::ideal_size((Fl_Widget_Type *)this,w,h);
  pFVar1 = (this->super_Fl_Button_Type).super_Fl_Widget_Type.o;
  *w = *w + (pFVar1->label_).size * 2 + -8;
  *h = (*h / 5) * 5;
  iVar2 = pFVar1->w_ / 3;
  if (pFVar1->h_ <= iVar2) {
    iVar2 = pFVar1->h_;
  }
  *w = (iVar2 - (pFVar1->label_).size) + *w + 8;
  return;
}

Assistant:

virtual void ideal_size(int &w, int &h) {
    Fl_Button_Type::ideal_size(w, h);
    int W = o->h();
    if (o->w()/3 < W) W = o->w()/3;
    w += W + 8 - o->labelsize();
  }